

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O1

Matrix44<float> * __thiscall
Imath_3_2::Matrix44<float>::inverse
          (Matrix44<float> *__return_storage_ptr__,Matrix44<float> *this,bool singExc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  invalid_argument *this_00;
  int i;
  long lVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 local_50;
  float local_48;
  float fStack_44;
  float local_40;
  float fStack_3c;
  float fStack_38;
  float fStack_34;
  undefined8 local_30;
  float local_28;
  float fStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  float local_14;
  
  if ((((this->x[0][3] != 0.0) || (fVar13 = this->x[1][3], fVar13 != 0.0)) || (NAN(fVar13))) ||
     (((fVar13 = this->x[2][3], fVar13 != 0.0 || (NAN(fVar13))) ||
      ((fVar13 = this->x[3][3], fVar13 != 1.0 || (NAN(fVar13))))))) {
    gjInverse(__return_storage_ptr__,this,singExc);
  }
  else {
    fVar13 = this->x[1][1];
    fVar10 = this->x[1][2];
    fVar11 = this->x[0][2];
    fVar14 = this->x[0][0];
    fVar1 = this->x[0][1];
    fVar2 = this->x[2][0];
    fVar3 = this->x[1][0];
    uVar4 = *(undefined8 *)(this->x[2] + 1);
    fVar16 = (float)uVar4;
    fVar17 = (float)((ulong)uVar4 >> 0x20);
    fVar15 = fVar13 * fVar17 - fVar10 * fVar16;
    local_40 = fVar2 * fVar10 - fVar17 * fVar3;
    local_50 = CONCAT44(fVar11 * fVar16 - fVar17 * fVar1,fVar15);
    local_48 = fVar1 * fVar10 - fVar11 * fVar13;
    fStack_44 = 0.0;
    fStack_3c = fVar17 * fVar14 - fVar11 * fVar2;
    fStack_38 = fVar11 * fVar3 - fVar10 * fVar14;
    fStack_34 = 0.0;
    fVar10 = fVar3 * fVar16 - fVar13 * fVar2;
    local_30 = CONCAT44(fVar2 * fVar1 - fVar16 * fVar14,fVar10);
    local_28 = fVar14 * fVar13 - fVar1 * fVar3;
    fStack_24 = 0.0;
    uStack_20 = 0;
    uStack_1c = 0;
    uStack_18 = 0;
    local_14 = 1.0;
    fVar10 = fVar10 * fVar11 + fVar15 * fVar14 + local_40 * fVar1;
    fVar13 = fVar10;
    if (fVar10 <= -fVar10) {
      fVar13 = -fVar10;
    }
    if (1.0 <= fVar13) {
      puVar5 = &local_50;
      lVar8 = 0;
      do {
        lVar6 = 0;
        do {
          *(float *)((long)puVar5 + lVar6 * 4) = *(float *)((long)puVar5 + lVar6 * 4) / fVar10;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        lVar8 = lVar8 + 1;
        puVar5 = puVar5 + 2;
      } while (lVar8 != 3);
    }
    else {
      puVar5 = &local_50;
      uVar7 = 0;
      bVar9 = false;
      do {
        lVar8 = 0;
        do {
          fVar11 = *(float *)((long)puVar5 + lVar8 * 4);
          fVar14 = fVar11;
          if (fVar11 <= -fVar11) {
            fVar14 = -fVar11;
          }
          if (fVar13 * 8.507059e+37 <= fVar14) {
            if (singExc) {
              this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
              __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            __return_storage_ptr__->x[0][0] = 1.0;
            auVar12._0_12_ = ZEXT812(0);
            auVar12._12_4_ = 0;
            *(undefined1 (*) [16])(__return_storage_ptr__->x[0] + 1) = auVar12;
            __return_storage_ptr__->x[1][1] = 1.0;
            *(undefined1 (*) [16])(__return_storage_ptr__->x[1] + 2) = auVar12;
            __return_storage_ptr__->x[2][2] = 1.0;
            *(undefined1 (*) [16])(__return_storage_ptr__->x[2] + 3) = auVar12;
            __return_storage_ptr__->x[3][3] = 1.0;
            if (!bVar9) {
              return __return_storage_ptr__;
            }
            goto LAB_0014a109;
          }
          *(float *)((long)puVar5 + lVar8 * 4) = fVar11 / fVar10;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        bVar9 = 1 < uVar7;
        uVar7 = uVar7 + 1;
        puVar5 = puVar5 + 2;
      } while (uVar7 != 3);
    }
LAB_0014a109:
    fVar11 = (float)((uint)this->x[3][0] ^ (uint)DAT_00166210);
    fVar13 = this->x[3][1];
    fVar10 = this->x[3][2];
    fVar14 = (float)((ulong)local_30 >> 0x20);
    *(undefined8 *)__return_storage_ptr__->x[0] = local_50;
    __return_storage_ptr__->x[0][2] = local_48;
    __return_storage_ptr__->x[0][3] = fStack_44;
    __return_storage_ptr__->x[1][0] = local_40;
    __return_storage_ptr__->x[1][1] = fStack_3c;
    __return_storage_ptr__->x[1][2] = fStack_38;
    __return_storage_ptr__->x[1][3] = fStack_34;
    __return_storage_ptr__->x[2][0] = (float)local_30;
    __return_storage_ptr__->x[2][1] = fVar14;
    __return_storage_ptr__->x[2][2] = local_28;
    __return_storage_ptr__->x[2][3] = fStack_24;
    __return_storage_ptr__->x[3][0] =
         (fVar11 * (float)local_50 - fVar13 * local_40) - fVar10 * (float)local_30;
    __return_storage_ptr__->x[3][1] =
         (fVar11 * (float)((ulong)local_50 >> 0x20) - fVar13 * fStack_3c) - fVar10 * fVar14;
    __return_storage_ptr__->x[3][2] = (fVar11 * local_48 - fVar13 * fStack_38) - fVar10 * local_28;
    __return_storage_ptr__->x[3][3] = local_14;
  }
  return __return_storage_ptr__;
}

Assistant:

IMATH_CONSTEXPR14 inline Matrix44<T>
Matrix44<T>::inverse (bool singExc) const
{
    if (x[0][3] != 0 || x[1][3] != 0 || x[2][3] != 0 || x[3][3] != 1)
        return gjInverse (singExc);

    Matrix44 s (
        x[1][1] * x[2][2] - x[2][1] * x[1][2],
        x[2][1] * x[0][2] - x[0][1] * x[2][2],
        x[0][1] * x[1][2] - x[1][1] * x[0][2],
        0,

        x[2][0] * x[1][2] - x[1][0] * x[2][2],
        x[0][0] * x[2][2] - x[2][0] * x[0][2],
        x[1][0] * x[0][2] - x[0][0] * x[1][2],
        0,

        x[1][0] * x[2][1] - x[2][0] * x[1][1],
        x[2][0] * x[0][1] - x[0][0] * x[2][1],
        x[0][0] * x[1][1] - x[1][0] * x[0][1],
        0,

        0,
        0,
        0,
        1);

    T r = x[0][0] * s.x[0][0] + x[0][1] * s.x[1][0] + x[0][2] * s.x[2][0];

    if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
    {
        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                s.x[i][j] /= r;
            }
        }
    }
    else
    {
        T mr =
            IMATH_INTERNAL_NAMESPACE::abs (r) / std::numeric_limits<T>::min ();

        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                if (mr > IMATH_INTERNAL_NAMESPACE::abs (s.x[i][j]))
                {
                    s.x[i][j] /= r;
                }
                else
                {
                    if (singExc)
                        throw std::invalid_argument (
                            "Cannot invert singular matrix.");

                    return Matrix44 ();
                }
            }
        }
    }

    s.x[3][0] =
        -x[3][0] * s.x[0][0] - x[3][1] * s.x[1][0] - x[3][2] * s.x[2][0];
    s.x[3][1] =
        -x[3][0] * s.x[0][1] - x[3][1] * s.x[1][1] - x[3][2] * s.x[2][1];
    s.x[3][2] =
        -x[3][0] * s.x[0][2] - x[3][1] * s.x[1][2] - x[3][2] * s.x[2][2];

    return s;
}